

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option.cpp
# Opt level: O3

bool usage(char *a0)

{
  char *pcVar1;
  FILE *__stream;
  QMAKE_MODE QVar2;
  storage_type *psVar3;
  storage_type *psVar4;
  char *pcVar5;
  char *pcVar6;
  long in_FS_OFFSET;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  QString local_98;
  QString local_78;
  QArrayData *local_58;
  char16_t *pcStack_50;
  qsizetype local_48;
  long local_38;
  
  __stream = _stdout;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (a0 == (char *)0x0) {
    psVar4 = (storage_type *)0x0;
  }
  else {
    psVar3 = (storage_type *)0xffffffffffffffff;
    do {
      psVar4 = psVar3 + 1;
      pcVar5 = a0 + 1 + (long)psVar3;
      psVar3 = psVar4;
    } while (*pcVar5 != '\0');
  }
  QVar7.m_data = psVar4;
  QVar7.m_size = (qsizetype)&local_58;
  QString::fromUtf8(QVar7);
  local_78.d.d = (Data *)local_58;
  local_78.d.ptr = pcStack_50;
  local_78.d.size = local_48;
  QVar2 = default_mode(&local_78);
  pcVar6 = "";
  pcVar5 = "";
  if (QVar2 == QMAKE_GENERATE_PROJECT) {
    pcVar5 = " (default)";
  }
  if (a0 == (char *)0x0) {
    psVar4 = (storage_type *)0x0;
  }
  else {
    psVar3 = (storage_type *)0xffffffffffffffff;
    do {
      psVar4 = psVar3 + 1;
      pcVar1 = a0 + 1 + (long)psVar3;
      psVar3 = psVar4;
    } while (*pcVar1 != '\0');
  }
  QVar8.m_data = psVar4;
  QVar8.m_size = (qsizetype)&local_58;
  QString::fromUtf8(QVar8);
  local_98.d.d = (Data *)local_58;
  local_98.d.ptr = pcStack_50;
  local_98.d.size = local_48;
  QVar2 = default_mode(&local_98);
  if (QVar2 == QMAKE_GENERATE_MAKEFILE) {
    pcVar6 = " (default)";
  }
  fprintf(__stream,
          "Usage: %s [mode] [options] [files]\n\nQMake has two modes, one mode for generating project files based on\nsome heuristics, and the other for generating makefiles. Normally you\nshouldn\'t need to specify a mode, as makefile generation is the default\nmode for qmake, but you may use this to test qmake on an existing project\n\nMode:\n  -project       Put qmake into project file generation mode%s\n                 In this mode qmake interprets [files] as files to\n                 be added to the .pro file. By default, all files with\n                 known source extensions are added.\n                 Note: The created .pro file probably will \n                 need to be edited. For example add the QT variable to \n                 specify what modules are required.\n  -makefile      Put qmake into makefile generation mode%s\n                 In this mode qmake interprets files as project files to\n                 be processed, if skipped qmake will try to find a project\n                 file in your current working directory\n\nWarnings Options:\n  -Wnone         Turn off all warnings; specific ones may be re-enabled by\n                 later -W options\n  -Wall          Turn on all warnings\n  -Wparser       Turn on parser warnings\n  -Wlogic        Turn on logic warnings (on by default)\n  -Wdeprecated   Turn on deprecation warnings (on by default)\n\nOptions:\n   * You can place any variable assignment in options and it will be *\n   * processed as if it was in [files]. These assignments will be    *\n   * processed before [files] by default.                            *\n  -o file        Write output to file\n  -d             Increase debug level\n  -t templ       Overrides TEMPLATE as templ\n  -tp prefix     Overrides TEMPLATE so that prefix is prefixed into the value\n  -help          This help\n  -v             Version information\n  -early         All subsequent variable assignments will be\n                 parsed right before default_pre.prf\n  -before        All subsequent variable assignments will be\n                 parsed right befor..." /* TRUNCATED STRING LITERAL */
          ,a0,pcVar5,pcVar6);
  if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return false;
}

Assistant:

bool usage(const char *a0)
{
    fprintf(stdout, "Usage: %s [mode] [options] [files]\n"
            "\n"
            "QMake has two modes, one mode for generating project files based on\n"
            "some heuristics, and the other for generating makefiles. Normally you\n"
            "shouldn't need to specify a mode, as makefile generation is the default\n"
            "mode for qmake, but you may use this to test qmake on an existing project\n"
            "\n"
            "Mode:\n"
            "  -project       Put qmake into project file generation mode%s\n"
            "                 In this mode qmake interprets [files] as files to\n"
            "                 be added to the .pro file. By default, all files with\n"
            "                 known source extensions are added.\n"
            "                 Note: The created .pro file probably will \n"
            "                 need to be edited. For example add the QT variable to \n"
            "                 specify what modules are required.\n"
            "  -makefile      Put qmake into makefile generation mode%s\n"
            "                 In this mode qmake interprets files as project files to\n"
            "                 be processed, if skipped qmake will try to find a project\n"
            "                 file in your current working directory\n"
            "\n"
            "Warnings Options:\n"
            "  -Wnone         Turn off all warnings; specific ones may be re-enabled by\n"
            "                 later -W options\n"
            "  -Wall          Turn on all warnings\n"
            "  -Wparser       Turn on parser warnings\n"
            "  -Wlogic        Turn on logic warnings (on by default)\n"
            "  -Wdeprecated   Turn on deprecation warnings (on by default)\n"
            "\n"
            "Options:\n"
            "   * You can place any variable assignment in options and it will be *\n"
            "   * processed as if it was in [files]. These assignments will be    *\n"
            "   * processed before [files] by default.                            *\n"
            "  -o file        Write output to file\n"
            "  -d             Increase debug level\n"
            "  -t templ       Overrides TEMPLATE as templ\n"
            "  -tp prefix     Overrides TEMPLATE so that prefix is prefixed into the value\n"
            "  -help          This help\n"
            "  -v             Version information\n"
            "  -early         All subsequent variable assignments will be\n"
            "                 parsed right before default_pre.prf\n"
            "  -before        All subsequent variable assignments will be\n"
            "                 parsed right before [files] (the default)\n"
            "  -after         All subsequent variable assignments will be\n"
            "                 parsed after [files]\n"
            "  -late          All subsequent variable assignments will be\n"
            "                 parsed right after default_post.prf\n"
            "  -norecursive   Don't do a recursive search\n"
            "  -recursive     Do a recursive search\n"
            "  -set <prop> <value> Set persistent property\n"
            "  -unset <prop>  Unset persistent property\n"
            "  -query <prop>  Query persistent property. Show all if <prop> is empty.\n"
            "  -qtconf file   Use file instead of looking for qt" QT_STRINGIFY(QT_VERSION_MAJOR) ".conf, then qt.conf\n"
            "  -cache file    Use file as cache           [makefile mode only]\n"
            "  -spec spec     Use spec as QMAKESPEC       [makefile mode only]\n"
            "  -nocache       Don't use a cache file      [makefile mode only]\n"
            "  -nodepend      Don't generate dependencies [makefile mode only]\n"
            "  -nomoc         Don't generate moc targets  [makefile mode only]\n"
            "  -nopwd         Don't look for files in pwd [project mode only]\n"
            ,a0,
            default_mode(a0) == Option::QMAKE_GENERATE_PROJECT  ? " (default)" : "",
            default_mode(a0) == Option::QMAKE_GENERATE_MAKEFILE ? " (default)" : ""
        );
    return false;
}